

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O0

S2Point * __thiscall S2PaddedCell::GetExitVertex(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int face;
  S2Point local_38;
  int local_1c;
  int local_18;
  int ij_size;
  uint j;
  uint i;
  S2PaddedCell *this_local;
  
  ij_size = this->ij_lo_[0];
  local_18 = this->ij_lo_[1];
  _j = this;
  local_1c = S2CellId::GetSizeIJ(this->level_);
  if ((this->orientation_ == 0) || (this->orientation_ == 3)) {
    ij_size = local_1c + ij_size;
  }
  else {
    local_18 = local_1c + local_18;
  }
  face = S2CellId::face(&this->id_);
  S2::FaceSiTitoXYZ(&local_38,face,ij_size << 1,local_18 << 1);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetExitVertex() const {
  // The curve exits at the (1,0) vertex unless the axes are swapped or
  // inverted but not both, in which case it exits at the (0,1) vertex.
  unsigned int i = ij_lo_[0];
  unsigned int j = ij_lo_[1];
  int ij_size = S2CellId::GetSizeIJ(level_);
  if (orientation_ == 0 || orientation_ == kSwapMask + kInvertMask) {
    i += ij_size;
  } else {
    j += ij_size;
  }
  return S2::FaceSiTitoXYZ(id_.face(), 2 * i, 2 * j).Normalize();
}